

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::KeyValue::KeyValue(KeyValue *this,KeyValue *other89)

{
  long in_RSI;
  TBase *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__KeyValue_00c02e38;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__KeyValue_00c02e38;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  _KeyValue__isset::_KeyValue__isset((_KeyValue__isset *)(in_RDI + 9));
  std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)(in_RSI + 8));
  std::__cxx11::string::operator=((string *)(in_RDI + 5),(string *)(in_RSI + 0x28));
  *(undefined1 *)&in_RDI[9]._vptr_TBase = *(undefined1 *)(in_RSI + 0x48);
  return;
}

Assistant:

KeyValue::KeyValue(const KeyValue& other89) {
  key = other89.key;
  value = other89.value;
  __isset = other89.__isset;
}